

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forrest_tomlin.cc
# Opt level: O0

void __thiscall
ipx::ForrestTomlin::ForrestTomlin
          (ForrestTomlin *this,Control *control,Int dim,
          unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> *lu)

{
  Int in_EDX;
  _func_int **in_RSI;
  LuUpdate *in_RDI;
  unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>
  *in_stack_ffffffffffffff68;
  unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>
  *in_stack_ffffffffffffff70;
  LuUpdate *this_00;
  valarray<double> *this_01;
  valarray<double> *this_02;
  SparseMatrix *this_03;
  
  LuUpdate::LuUpdate(in_RDI);
  in_RDI->_vptr_LuUpdate = (_func_int **)&PTR__ForrestTomlin_0096e808;
  in_RDI[1]._vptr_LuUpdate = in_RSI;
  in_RDI[1].updates_ = in_EDX;
  std::unique_ptr<ipx::LuFactorization,std::default_delete<ipx::LuFactorization>>::
  unique_ptr<std::default_delete<ipx::LuFactorization>,void>(in_stack_ffffffffffffff70);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81b40f);
  this_03 = (SparseMatrix *)(in_RDI + 4);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81b422);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81b435);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81b448);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81b45e);
  SparseMatrix::SparseMatrix(this_03);
  SparseMatrix::SparseMatrix(this_03);
  this_02 = (valarray<double> *)(in_RDI + 0x1a);
  SparseMatrix::SparseMatrix(this_03);
  this_00 = in_RDI + 0x22;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x81b4bc);
  in_RDI[0x23].field_0xc = 0;
  in_RDI[0x23].field_0xd = 0;
  in_RDI[0x24]._vptr_LuUpdate = (_func_int **)0x0;
  *(undefined8 *)&in_RDI[0x24].updates_ = 0x3fb999999999999a;
  this_01 = (valarray<double> *)(in_RDI + 0x25);
  std::valarray<double>::valarray(this_01);
  std::valarray<double>::resize(this_02,(size_t)this_01,(double)this_00);
  std::unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_>::operator=
            ((unique_ptr<ipx::LuFactorization,_std::default_delete<ipx::LuFactorization>_> *)this_00
             ,in_stack_ffffffffffffff68);
  return;
}

Assistant:

ForrestTomlin::ForrestTomlin(const Control& control, Int dim,
                             std::unique_ptr<LuFactorization>& lu) :
    control_(control), dim_(dim) {
    work_.resize(dim_ + kMaxUpdates);
    lu_ = std::move(lu);
}